

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleInstruction
          (Disassembler *this,spv_parsed_instruction_t *inst)

{
  spv_parsed_operand_t **ppsVar1;
  pointer *ppSVar2;
  ControlFlowGraph *cfg;
  undefined8 *puVar3;
  char cVar4;
  short sVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  pointer pPVar8;
  long lVar9;
  ushort *puVar10;
  uint32_t *puVar11;
  pointer puVar12;
  _Map_pointer ppSVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  bool bVar16;
  undefined1 auVar17 [8];
  _Rb_tree_node<unsigned_int> *p_Var18;
  uint uVar19;
  mapped_type *pmVar20;
  spv_parsed_instruction_t *psVar21;
  iterator iVar22;
  pointer pSVar23;
  pointer pSVar24;
  pointer pSVar25;
  ulong uVar26;
  _Rb_tree_node<unsigned_int> *p_Var27;
  ulong uVar28;
  uint32_t *puVar29;
  spv_parsed_operand_t *psVar30;
  spv_parsed_operand_t **ppsVar31;
  pointer pSVar32;
  InstructionDisassembler *pIVar33;
  _Rb_tree_node<unsigned_int> *p_Var34;
  _Rb_tree_node<unsigned_int> *p_Var35;
  ulong uVar36;
  size_t inst_byte_offset;
  long lVar37;
  pointer pSVar38;
  ParsedInstruction *inst_1;
  pointer pPVar39;
  uint32_t block_index;
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_order;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  id_to_index;
  uint *local_140;
  undefined1 local_138 [8];
  iterator iStack_130;
  uint *local_128;
  undefined1 local_120 [8];
  pointer local_118;
  pointer pPStack_110;
  pointer local_108;
  spv_parsed_operand_t *psStack_100;
  spv_parsed_operand_t **local_f8;
  spv_parsed_operand_t *psStack_f0;
  spv_parsed_operand_t *local_e8;
  undefined6 uStack_e0;
  undefined2 uStack_da;
  undefined6 uStack_d8;
  undefined2 uStack_d2;
  uint32_t uStack_d0;
  undefined2 uStack_cc;
  void *local_c8;
  iterator iStack_c0;
  uint *local_b8;
  InstructionDisassembler *local_b0;
  spv_parsed_instruction_t *local_a8;
  undefined1 local_a0 [8];
  _Rb_tree_node<unsigned_int> local_98;
  void *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  pIVar33 = &this->instruction_disassembler_;
  disassemble::InstructionDisassembler::EmitSectionComment
            (pIVar33,inst,&this->inserted_decoration_space_,&this->inserted_debug_space_,
             &this->inserted_type_space_);
  if ((this->nested_indent_ != false) || (this->reorder_blocks_ == true)) {
    if (inst->opcode == 0x38) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      pSVar23 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = pIVar33;
      local_a8 = inst;
      if ((this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar23) {
        uVar36 = 0;
        do {
          pPVar39 = pSVar23[uVar36].instructions.
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pPVar39->instruction_).opcode != 0xf8) {
            __assert_fail("static_cast<spv::Op>(block.instructions[0].get()->opcode) == spv::Op::OpLabel"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                          ,0xf5,
                          "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                         );
          }
          local_120._0_4_ = (pPVar39->instruction_).result_id;
          pmVar20 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_68,(key_type *)local_120);
          *pmVar20 = (mapped_type)uVar36;
          pPVar39 = pSVar23[uVar36].instructions.
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar8 = pSVar23[uVar36].instructions.
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar37 = (long)pPVar8 - (long)pPVar39;
          uVar26 = (lVar37 >> 4) * -0x5555555555555555;
          if (2 < uVar26) {
            sVar5 = *(short *)((long)pPVar39 + lVar37 + -0x56);
            if (sVar5 == 0xf7) {
              pSVar23[uVar36].successors.merge_block_id =
                   *(uint32_t *)
                    (*(long *)((long)pPVar39 + lVar37 + -0x60) +
                    (ulong)**(ushort **)((long)pPVar39 + lVar37 + -0x48) * 4);
            }
            else if (sVar5 == 0xf6) {
              lVar9 = *(long *)((long)pPVar39 + lVar37 + -0x60);
              puVar10 = *(ushort **)((long)pPVar39 + lVar37 + -0x48);
              pSVar23[uVar36].successors.merge_block_id = *(uint32_t *)(lVar9 + (ulong)*puVar10 * 4)
              ;
              pSVar23[uVar36].successors.continue_block_id =
                   *(uint32_t *)(lVar9 + (ulong)puVar10[8] * 4);
            }
          }
          if (uVar26 < 2) {
            __assert_fail("block.instructions.size() >= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                          ,0x110,
                          "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                         );
          }
          uVar6 = pPVar8[-1].instruction_.opcode;
          if (uVar6 == 0xf9) {
            uVar7 = pPVar8[-1].instruction_.words[(pPVar8[-1].instruction_.operands)->offset];
            if (pSVar23[uVar36].successors.merge_block_id == 0) {
              pSVar23[uVar36].successors.next_block_id = uVar7;
            }
            else {
              pSVar23[uVar36].successors.body_block_id = uVar7;
            }
          }
          else if (uVar6 == 0xfa) {
            puVar29 = pPVar8[-1].instruction_.words;
            psVar30 = pPVar8[-1].instruction_.operands;
            pSVar23[uVar36].successors.true_block_id = puVar29[psVar30[1].offset];
            pSVar23[uVar36].successors.false_block_id = puVar29[psVar30[2].offset];
          }
          else if ((uVar6 == 0xfb) && (1 < pPVar8[-1].instruction_.num_operands)) {
            uVar26 = 1;
            lVar37 = 0x10;
            do {
              local_a0._0_4_ =
                   pPVar8[-1].instruction_.words
                   [*(ushort *)((long)&(pPVar8[-1].instruction_.operands)->offset + lVar37)];
              iVar22._M_current =
                   pSVar23[uVar36].successors.case_block_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar22._M_current ==
                  pSVar23[uVar36].successors.case_block_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&pSVar23[uVar36].successors.case_block_ids,iVar22,(uint *)local_a0);
              }
              else {
                *iVar22._M_current = local_a0._0_4_;
                pSVar23[uVar36].successors.case_block_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar22._M_current + 1;
              }
              uVar26 = uVar26 + 2;
              lVar37 = lVar37 + 0x20;
            } while (uVar26 < pPVar8[-1].instruction_.num_operands);
          }
          uVar36 = uVar36 + 1;
          pSVar23 = (this->current_function_cfg_).blocks.
                    super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar36 < (ulong)(((long)(this->current_function_cfg_).blocks.
                                         super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar23
                                  >> 3) * 0x2e8ba2e8ba2e8ba3));
      }
      local_b8 = (uint *)0x0;
      local_c8 = (void *)0x0;
      iStack_c0._M_current = (uint *)0x0;
      pSVar23->nest_level = 0;
      pSVar23->nest_level_assigned = true;
      local_118 = (pointer)0x8;
      psVar21 = (spv_parsed_instruction_t *)operator_new(0x40);
      ppsVar31 = &psVar21->operands;
      local_120 = (undefined1  [8])psVar21;
      pPStack_110 = (pointer)operator_new(0x200);
      psVar21->operands = (spv_parsed_operand_t *)pPStack_110;
      psStack_100 = (spv_parsed_operand_t *)((long)pPStack_110 + 0x200);
      uStack_d8 = SUB86(ppsVar31,0);
      uStack_d2 = (undefined2)((ulong)ppsVar31 >> 0x30);
      uStack_e0 = SUB86(psStack_100,0);
      uStack_da = (undefined2)((ulong)psStack_100 >> 0x30);
      local_a0._0_4_ = 0;
      local_a0[4] = false;
      local_108 = pPStack_110;
      local_f8 = ppsVar31;
      psStack_f0 = (spv_parsed_operand_t *)pPStack_110;
      local_e8 = (spv_parsed_operand_t *)pPStack_110;
      std::
      stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
      ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
              *)local_120,(value_type *)local_a0);
      local_98.super__Rb_tree_node_base._M_left = &local_98.super__Rb_tree_node_base;
      local_98.super__Rb_tree_node_base._M_color = _S_red;
      local_98.super__Rb_tree_node_base._M_parent = (_Base_ptr)0x0;
      local_98._32_8_ = 0;
      iVar22._M_current = (uint *)0x0;
      local_70 = (void *)0x0;
      local_98.super__Rb_tree_node_base._M_right = local_98.super__Rb_tree_node_base._M_left;
      if ((pointer)psStack_f0 != pPStack_110) {
        cfg = &this->current_function_cfg_;
        psVar30 = psStack_f0;
        pPVar39 = pPStack_110;
        do {
          if (psVar30 == local_e8) {
            lVar37 = CONCAT26(uStack_d2,uStack_d8);
            local_140 = (uint *)CONCAT44(local_140._4_4_,
                                         *(undefined4 *)(*(long *)(lVar37 + -8) + 0x1f8));
            cVar4 = *(char *)(*(long *)(lVar37 + -8) + 0x1fc);
            operator_delete(local_e8,0x200);
            uStack_d8 = (undefined6)(lVar37 + -8);
            uStack_d2 = (undefined2)((ulong)(lVar37 + -8) >> 0x30);
            local_e8 = *(spv_parsed_operand_t **)(lVar37 + -8);
            uStack_e0 = SUB86(local_e8 + 0x20,0);
            uStack_da = (undefined2)((ulong)(local_e8 + 0x20) >> 0x30);
            psStack_f0 = (spv_parsed_operand_t *)&local_e8[0x1f].number_kind;
            if (cVar4 != '\x01') goto LAB_001b479b;
LAB_001b46ff:
            psVar30 = psStack_f0;
            if (iStack_c0._M_current == local_b8) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,iStack_c0,
                         (uint *)&local_140);
            }
            else {
              *iStack_c0._M_current = (uint)local_140;
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
          }
          else {
            local_140 = (uint *)CONCAT44(local_140._4_4_,psVar30[-1].number_kind);
            psStack_f0 = (spv_parsed_operand_t *)&psVar30[-1].number_kind;
            if ((char)psVar30[-1].number_bit_width != '\0') goto LAB_001b46ff;
LAB_001b479b:
            if ((_Rb_tree_node<unsigned_int> *)local_98.super__Rb_tree_node_base._M_parent ==
                (_Rb_tree_node<unsigned_int> *)0x0) {
LAB_001b47f2:
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)local_a0,(uint *)&local_140);
              local_138[4] = true;
              local_138._0_4_ = (uint)local_140;
              std::
              stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
              ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                      *)local_120,(value_type *)local_138);
              uVar36 = (ulong)local_140 & 0xffffffff;
              pSVar23 = (cfg->blocks).
                        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pSVar23[uVar36].nest_level_assigned == false) {
                __assert_fail("block.nest_level_assigned",
                              "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                              ,0x147,
                              "void spvtools::(anonymous namespace)::NestSuccessors(ControlFlowGraph &, const SingleBlock &, const std::unordered_map<uint32_t, uint32_t> &)"
                             );
              }
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.merge_block_id,
                   pSVar23[uVar36].nest_level);
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.continue_block_id,
                   pSVar23[uVar36].nest_level + 1);
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.true_block_id,
                   pSVar23[uVar36].nest_level + 2);
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.false_block_id,
                   pSVar23[uVar36].nest_level + 2);
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.body_block_id,
                   pSVar23[uVar36].nest_level + 2);
              Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&local_68,pSVar23[uVar36].successors.next_block_id,
                   pSVar23[uVar36].nest_level);
              puVar11 = *(pointer *)((long)&pSVar23[uVar36].successors.case_block_ids + 8);
              for (puVar29 = *(uint32_t **)
                              &pSVar23[uVar36].successors.case_block_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl; puVar29 != puVar11; puVar29 = puVar29 + 1) {
                Nest(cfg,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&local_68,*puVar29,pSVar23[uVar36].nest_level + 2);
              }
              pSVar23[uVar36].reachable = true;
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.true_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.false_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.body_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.next_block_id);
              puVar11 = *(pointer *)((long)&pSVar23[uVar36].successors.case_block_ids + 8);
              for (puVar29 = *(uint32_t **)
                              &pSVar23[uVar36].successors.case_block_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl; puVar29 != puVar11; puVar29 = puVar29 + 1) {
                VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                               *)local_120,
                              (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&local_68,*puVar29);
              }
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.continue_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_120,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar23[uVar36].successors.merge_block_id);
              psVar30 = psStack_f0;
              pPVar39 = pPStack_110;
            }
            else {
              p_Var18 = (_Rb_tree_node<unsigned_int> *)local_98.super__Rb_tree_node_base._M_parent;
              p_Var35 = &local_98;
              do {
                p_Var34 = p_Var35;
                p_Var27 = p_Var18;
                uVar19 = *(uint *)(p_Var27->_M_storage)._M_storage;
                p_Var35 = p_Var27;
                if (uVar19 < (uint)local_140) {
                  p_Var35 = p_Var34;
                }
                p_Var18 = *(_Rb_tree_node<unsigned_int> **)
                           (&p_Var27->_M_storage + (ulong)(uVar19 < (uint)local_140) * 2 + -4);
              } while (*(_Rb_tree_node<unsigned_int> **)
                        (&p_Var27->_M_storage + (ulong)(uVar19 < (uint)local_140) * 2 + -4) !=
                       (_Rb_tree_node<unsigned_int> *)0x0);
              if (p_Var35 == &local_98) goto LAB_001b47f2;
              if (uVar19 < (uint)local_140) {
                p_Var27 = p_Var34;
              }
              psVar30 = psStack_f0;
              if ((uint)local_140 < *(uint *)(p_Var27->_M_storage)._M_storage) goto LAB_001b47f2;
            }
          }
          iVar22._M_current = iStack_c0._M_current;
          local_70 = local_c8;
        } while ((pointer)psVar30 != pPVar39);
      }
      local_138._0_4_ = 0;
      local_138[4] = false;
      local_138._5_3_ = 0;
      iStack_130._M_current = (uint *)0x0;
      local_128 = (uint *)0x0;
      local_140 = iVar22._M_current;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                ();
      pSVar23 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar25 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar25 != pSVar23) {
        lVar37 = 0x55;
        uVar36 = 0;
        pSVar32 = pSVar23;
        do {
          if (*(char *)((long)&pSVar32->byte_offset + lVar37) == '\0') {
            local_140 = (uint *)CONCAT44(local_140._4_4_,(uint)uVar36);
            if (iStack_130._M_current == local_128) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_138,iStack_130
                         ,(uint *)&local_140);
              pSVar23 = (this->current_function_cfg_).blocks.
                        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar25 = (this->current_function_cfg_).blocks.
                        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              *iStack_130._M_current = (uint)uVar36;
              iStack_130._M_current = iStack_130._M_current + 1;
            }
            *(undefined4 *)((long)pSVar32 + lVar37 + -5) = 0;
            *(undefined1 *)((long)pSVar32 + lVar37 + -1) = 1;
            pSVar32 = pSVar23;
          }
          uVar36 = uVar36 + 1;
          lVar37 = lVar37 + 0x58;
        } while (uVar36 < (ulong)(((long)pSVar25 - (long)pSVar32 >> 3) * 0x2e8ba2e8ba2e8ba3));
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_a0,(_Link_type)local_98.super__Rb_tree_node_base._M_parent);
      auVar17 = local_120;
      if (local_120 != (undefined1  [8])0x0) {
        ppSVar13 = (_Map_pointer)CONCAT26(uStack_d2,uStack_d8);
        if (local_f8 < ppSVar13 + 1) {
          ppsVar31 = local_f8 + -1;
          do {
            ppsVar1 = ppsVar31 + 1;
            ppsVar31 = ppsVar31 + 1;
            operator_delete(*ppsVar1,0x200);
          } while (ppsVar31 < ppSVar13);
        }
        operator_delete((void *)auVar17,(long)local_118 << 3);
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8,(long)local_b8 - (long)local_c8);
      }
      pSVar23 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar25 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)iStack_130._M_current - (long)local_138 >> 2 !=
          ((long)pSVar25 - (long)pSVar23 >> 3) * 0x2e8ba2e8ba2e8ba3) {
        __assert_fail("block_order.size() == current_function_cfg_.blocks.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                      ,0x1f1,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
      }
      if (pSVar25 != pSVar23) {
        uVar36 = 0;
        do {
          pIVar33 = local_b0;
          uVar19 = (uint)uVar36;
          if (this->reorder_blocks_ == true) {
            uVar19 = *(uint *)((long)local_138 + uVar36 * 4);
          }
          if (pSVar23[uVar19].nest_level_assigned == false) {
            __assert_fail("block.nest_level_assigned",
                          "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/disassemble.cpp"
                          ,0x1fc,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
          }
          pSVar32 = pSVar23 + uVar19;
          pPVar39 = (pSVar32->instructions).
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar8 = (pSVar32->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar39 != pPVar8) {
            inst_byte_offset = pSVar32->byte_offset;
            do {
              disassemble::InstructionDisassembler::EmitInstructionImpl
                        (pIVar33,&pPVar39->instruction_,inst_byte_offset,pSVar32->nest_level,true);
              inst_byte_offset = inst_byte_offset + (ulong)(pPVar39->instruction_).num_words * 4;
              pPVar39 = pPVar39 + 1;
            } while (pPVar39 != pPVar8);
            pSVar23 = (this->current_function_cfg_).blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar25 = (this->current_function_cfg_).blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar36 = (ulong)((uint)uVar36 + 1);
          uVar26 = ((long)pSVar25 - (long)pSVar23 >> 3) * 0x2e8ba2e8ba2e8ba3;
        } while (uVar36 <= uVar26 && uVar26 - uVar36 != 0);
        pSVar32 = pSVar23;
        if (pSVar25 != pSVar23) {
          do {
            puVar12 = (pSVar32->successors).case_block_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (puVar12 != (pointer)0x0) {
              operator_delete(puVar12,(long)(pSVar32->successors).case_block_ids.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)puVar12);
            }
            pPVar39 = (pSVar32->instructions).
                      super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar8 = (pSVar32->instructions).
                     super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pPVar39 != pPVar8) {
              do {
                psVar30 = (pPVar39->operands_)._M_t.
                          super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
                          .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl;
                if (psVar30 != (spv_parsed_operand_t *)0x0) {
                  operator_delete__(psVar30);
                }
                (pPVar39->operands_)._M_t.
                super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
                .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl =
                     (spv_parsed_operand_t *)0x0;
                pPVar39 = pPVar39 + 1;
              } while (pPVar39 != pPVar8);
              pPVar39 = (pSVar32->instructions).
                        super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            if (pPVar39 != (pointer)0x0) {
              operator_delete(pPVar39,(long)(pSVar32->instructions).
                                            super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pPVar39);
            }
            pSVar32 = pSVar32 + 1;
          } while (pSVar32 != pSVar25);
          (this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar23;
        }
      }
      if ((value_type)local_138 != (value_type)0x0) {
        operator_delete((void *)local_138,(long)local_128 - (long)local_138);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      pIVar33 = local_b0;
      inst = local_a8;
    }
    else if (inst->opcode == 0xf8) {
      uStack_d8 = 0;
      uStack_d2 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_e8 = (spv_parsed_operand_t *)0x0;
      uStack_e0 = 0;
      uStack_da = 0;
      local_f8 = (spv_parsed_operand_t **)0x0;
      psStack_f0 = (spv_parsed_operand_t *)0x0;
      local_108 = (pointer)0x0;
      psStack_100 = (spv_parsed_operand_t *)0x0;
      local_118 = (pointer)0x0;
      pPStack_110 = (pointer)0x0;
      local_120 = (undefined1  [8])this->byte_offset_;
      local_68._M_buckets = (__buckets_ptr)inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&local_118,(spv_parsed_instruction_t **)&local_68);
      pSVar23 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar23 ==
          (this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pSVar25 = (this->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar37 = (long)pSVar23 - (long)pSVar25;
        if (lVar37 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar26 = (lVar37 >> 3) * 0x2e8ba2e8ba2e8ba3;
        uVar36 = 1;
        if (pSVar23 != pSVar25) {
          uVar36 = uVar26;
        }
        uVar28 = uVar36 + uVar26;
        if (0x1745d1745d1745c < uVar28) {
          uVar28 = 0x1745d1745d1745d;
        }
        if (CARRY8(uVar36,uVar26)) {
          uVar28 = 0x1745d1745d1745d;
        }
        pSVar24 = (pointer)operator_new(uVar28 * 0x58);
        *(undefined1 (*) [8])((long)pSVar24 + lVar37) = local_120;
        puVar3 = (undefined8 *)((long)pSVar24 + lVar37 + 8);
        *puVar3 = local_118;
        puVar3[1] = pPStack_110;
        *(pointer *)((long)pSVar24 + lVar37 + 0x18) = local_108;
        *(spv_parsed_operand_t **)((long)pSVar24 + lVar37 + 0x30) = psStack_f0;
        puVar3 = (undefined8 *)((long)pSVar24 + lVar37 + 0x20);
        *puVar3 = psStack_100;
        puVar3[1] = local_f8;
        puVar3 = (undefined8 *)((long)pSVar24 + lVar37 + 0x38);
        *puVar3 = local_e8;
        puVar3[1] = CONCAT26(uStack_da,uStack_e0);
        *(ulong *)((long)pSVar24 + lVar37 + 0x48) = CONCAT26(uStack_d2,uStack_d8);
        *(undefined2 *)((long)pSVar24 + lVar37 + 0x54) = uStack_cc;
        *(uint32_t *)((long)pSVar24 + lVar37 + 0x50) = uStack_d0;
        pSVar38 = pSVar24;
        for (pSVar32 = pSVar25; pSVar23 != pSVar32; pSVar32 = pSVar32 + 1) {
          pSVar38->byte_offset = pSVar32->byte_offset;
          pPVar39 = (pSVar32->instructions).
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           &(pSVar38->instructions).
            super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
            ._M_impl = (pSVar32->instructions).
                       super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(pSVar38->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           + 8) = pPVar39;
          *(pointer *)
           ((long)&(pSVar38->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           + 0x10) = (pSVar32->instructions).
                     super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pSVar32->instructions).
          super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pSVar32->instructions).
          super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pSVar32->instructions).
          super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar7 = (pSVar32->successors).next_block_id;
          (pSVar38->successors).body_block_id = (pSVar32->successors).body_block_id;
          (pSVar38->successors).next_block_id = uVar7;
          uVar7 = (pSVar32->successors).continue_block_id;
          uVar14 = (pSVar32->successors).true_block_id;
          uVar15 = (pSVar32->successors).false_block_id;
          (pSVar38->successors).merge_block_id = (pSVar32->successors).merge_block_id;
          (pSVar38->successors).continue_block_id = uVar7;
          (pSVar38->successors).true_block_id = uVar14;
          (pSVar38->successors).false_block_id = uVar15;
          puVar12 = (pSVar32->successors).case_block_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          *(pointer *)
           &(pSVar38->successors).case_block_ids.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl =
               (pSVar32->successors).case_block_ids.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)((long)&(pSVar38->successors).case_block_ids + 8) = puVar12;
          *(pointer *)((long)&(pSVar38->successors).case_block_ids + 0x10) =
               (pSVar32->successors).case_block_ids.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (pSVar32->successors).case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pSVar32->successors).case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pSVar32->successors).case_block_ids.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar16 = pSVar32->reachable;
          pSVar38->nest_level_assigned = pSVar32->nest_level_assigned;
          pSVar38->reachable = bVar16;
          pSVar38->nest_level = pSVar32->nest_level;
          pSVar38 = pSVar38 + 1;
        }
        if (pSVar25 != (pointer)0x0) {
          operator_delete(pSVar25,(long)(this->current_function_cfg_).blocks.
                                        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pSVar25);
        }
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start = pSVar24;
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar38 + 1;
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar24 + uVar28;
      }
      else {
        pSVar23->byte_offset = (size_t)local_120;
        (pSVar23->instructions).
        super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
        ._M_impl.super__Vector_impl_data._M_start = local_118;
        (pSVar23->instructions).
        super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPStack_110;
        (pSVar23->instructions).
        super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_108;
        *(spv_parsed_operand_t **)&pSVar23->successors = psStack_100;
        *(spv_parsed_operand_t ***)&(pSVar23->successors).true_block_id = local_f8;
        *(spv_parsed_operand_t **)&(pSVar23->successors).body_block_id = psStack_f0;
        (pSVar23->successors).case_block_ids.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8;
        (pSVar23->successors).case_block_ids.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)CONCAT26(uStack_da,uStack_e0);
        (pSVar23->successors).case_block_ids.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT26(uStack_d2,uStack_d8);
        pSVar23->nest_level = uStack_d0;
        pSVar23->nest_level_assigned = (bool)(undefined1)uStack_cc;
        pSVar23->reachable = (bool)uStack_cc._1_1_;
        ppSVar2 = &(this->current_function_cfg_).blocks.
                   super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      goto LAB_001b4ca6;
    }
    pSVar23 = (this->current_function_cfg_).blocks.
              super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start != pSVar23) {
      local_120 = (undefined1  [8])inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&pSVar23[-1].instructions,(spv_parsed_instruction_t **)local_120);
      goto LAB_001b4ca6;
    }
  }
  disassemble::InstructionDisassembler::EmitInstructionImpl(pIVar33,inst,this->byte_offset_,0,false)
  ;
LAB_001b4ca6:
  lVar37 = (ulong)inst->num_words * 4;
  this->byte_offset_ = this->byte_offset_ + lVar37;
  return (spv_result_t)lVar37;
}

Assistant:

spv_result_t Disassembler::HandleInstruction(
    const spv_parsed_instruction_t& inst) {
  instruction_disassembler_.EmitSectionComment(inst, inserted_decoration_space_,
                                               inserted_debug_space_,
                                               inserted_type_space_);

  // When nesting needs to be calculated or when the blocks are reordered, we
  // have to have the full picture of the CFG first.  Defer processing of the
  // instructions until the entire function is visited.  This is not done
  // without those options (even if simpler) to improve debuggability; for
  // example to be able to see whatever is parsed so far even if there is a
  // parse error.
  if (nested_indent_ || reorder_blocks_) {
    switch (static_cast<spv::Op>(inst.opcode)) {
      case spv::Op::OpLabel: {
        // Add a new block to the CFG
        SingleBlock new_block;
        new_block.byte_offset = byte_offset_;
        new_block.instructions.emplace_back(&inst);
        current_function_cfg_.blocks.push_back(std::move(new_block));
        break;
      }
      case spv::Op::OpFunctionEnd:
        // Process the CFG and output the instructions
        EmitCFG();
        // Output OpFunctionEnd itself too
        [[fallthrough]];
      default:
        if (!current_function_cfg_.blocks.empty()) {
          // If in a function, stash the instruction for later.
          current_function_cfg_.blocks.back().instructions.emplace_back(&inst);
        } else {
          // Otherwise emit the instruction right away.
          instruction_disassembler_.EmitInstruction(inst, byte_offset_);
        }
        break;
    }
  } else {
    instruction_disassembler_.EmitInstruction(inst, byte_offset_);
  }

  byte_offset_ += inst.num_words * sizeof(uint32_t);

  return SPV_SUCCESS;
}